

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O0

uint m68k_disassemble(char *str_buff,uint pc,uint cpu_type)

{
  uint cpu_type_local;
  uint pc_local;
  char *str_buff_local;
  
  if (g_initialized == 0) {
    build_opcode_table();
    g_initialized = 1;
  }
  switch(cpu_type) {
  case 1:
    g_cpu_type = 1;
    g_address_mask = 0xffffff;
    break;
  case 2:
    g_cpu_type = 2;
    g_address_mask = 0xffffff;
    break;
  case 3:
    g_cpu_type = 4;
    g_address_mask = 0xffffff;
    break;
  case 4:
    g_cpu_type = 4;
    g_address_mask = 0xffffffff;
    break;
  case 5:
  case 6:
    g_cpu_type = 8;
    g_address_mask = 0xffffffff;
    break;
  case 7:
  case 8:
  case 9:
    g_cpu_type = 0x10;
    g_address_mask = 0xffffffff;
    break;
  default:
    return 0;
  }
  g_helper_str[0] = '\0';
  g_cpu_pc = pc;
  g_cpu_ir = dasm_read_imm_16(2);
  g_opcode_type = 0;
  (*g_instruction_table[g_cpu_ir])();
  sprintf(str_buff,"%s%s",g_dasm_str,g_helper_str);
  return g_cpu_pc - pc;
}

Assistant:

unsigned int m68k_disassemble(char* str_buff, unsigned int pc, unsigned int cpu_type)
{
	if(!g_initialized)
	{
		build_opcode_table();
		g_initialized = 1;
	}
	switch(cpu_type)
	{
		case M68K_CPU_TYPE_68000:
			g_cpu_type = TYPE_68000;
			g_address_mask = 0x00ffffff;
			break;
		case M68K_CPU_TYPE_68010:
			g_cpu_type = TYPE_68010;
			g_address_mask = 0x00ffffff;
			break;
		case M68K_CPU_TYPE_68EC020:
			g_cpu_type = TYPE_68020;
			g_address_mask = 0x00ffffff;
			break;
		case M68K_CPU_TYPE_68020:
			g_cpu_type = TYPE_68020;
			g_address_mask = 0xffffffff;
			break;
		case M68K_CPU_TYPE_68EC030:
		case M68K_CPU_TYPE_68030:
			g_cpu_type = TYPE_68030;
			g_address_mask = 0xffffffff;
			break;
		case M68K_CPU_TYPE_68040:
		case M68K_CPU_TYPE_68EC040:
		case M68K_CPU_TYPE_68LC040:
			g_cpu_type = TYPE_68040;
			g_address_mask = 0xffffffff;
			break;
		default:
			return 0;
	}

	g_cpu_pc = pc;
	g_helper_str[0] = 0;
	g_cpu_ir = read_imm_16();
	g_opcode_type = 0;
	g_instruction_table[g_cpu_ir]();
	sprintf(str_buff, "%s%s", g_dasm_str, g_helper_str);
	return COMBINE_OPCODE_FLAGS(g_cpu_pc - pc);
}